

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O0

int x509_get_crl_entry_ext(uchar **p,uchar *end,mbedtls_x509_buf *ext)

{
  int iVar1;
  size_t local_38;
  size_t len;
  mbedtls_x509_buf *pmStack_28;
  int ret;
  mbedtls_x509_buf *ext_local;
  uchar *end_local;
  uchar **p_local;
  
  local_38 = 0;
  if (*p < end) {
    ext->tag = (uint)**p;
    ext->p = *p;
    pmStack_28 = ext;
    ext_local = (mbedtls_x509_buf *)end;
    end_local = (uchar *)p;
    iVar1 = mbedtls_asn1_get_tag(p,end,&ext->len,0x30);
    if (iVar1 == 0) {
      ext_local = (mbedtls_x509_buf *)(*(long *)end_local + pmStack_28->len);
      if (ext_local == (mbedtls_x509_buf *)(*(long *)end_local + pmStack_28->len)) {
        while (len._4_4_ = 0, *(mbedtls_x509_buf **)end_local < ext_local) {
          iVar1 = mbedtls_asn1_get_tag((uchar **)end_local,(uchar *)ext_local,&local_38,0x30);
          if (iVar1 != 0) {
            return iVar1 + -0x2500;
          }
          *(size_t *)end_local = local_38 + *(long *)end_local;
        }
        if (*(mbedtls_x509_buf **)end_local == ext_local) {
          p_local._4_4_ = 0;
        }
        else {
          p_local._4_4_ = -0x2566;
        }
      }
      else {
        p_local._4_4_ = -0x2566;
      }
    }
    else if (iVar1 == -0x62) {
      pmStack_28->p = (uchar *)0x0;
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = iVar1 + -0x2500;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_crl_entry_ext( unsigned char **p,
                             const unsigned char *end,
                             mbedtls_x509_buf *ext )
{
    int ret;
    size_t len = 0;

    /* OPTIONAL */
    if( end <= *p )
        return( 0 );

    ext->tag = **p;
    ext->p = *p;

    /*
     * Get CRL-entry extension sequence header
     * crlEntryExtensions      Extensions OPTIONAL  -- if present, MUST be v2
     */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &ext->len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        {
            ext->p = NULL;
            return( 0 );
        }
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );
    }

    end = *p + ext->len;

    if( end != *p + ext->len )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    while( *p < end )
    {
        if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
                MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        *p += len;
    }

    if( *p != end )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}